

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SourceCodeModel.cpp
# Opt level: O2

string * __thiscall
soul::getInitialiserValue_abi_cxx11_(string *__return_storage_ptr__,soul *this,CodeLocation *name)

{
  bool bVar1;
  CodeLocation CStack_78;
  CodeLocationRange range;
  CodeLocation local_48;
  CodeLocation local_38;
  string local_28;
  
  range.end.sourceCode.object = (SourceCodeText *)0x0;
  range.end.location.data = (char *)0x0;
  range.start.sourceCode.object = (SourceCodeText *)0x0;
  range.start.location.data = (char *)0x0;
  local_38.sourceCode.object = *(SourceCodeText **)this;
  if (local_38.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_38.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_38.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_38.location.data = *(char **)(this + 8);
  SourceCodeUtilities::findNextOccurrence((SourceCodeUtilities *)&CStack_78,&local_38,'=');
  CodeLocation::operator=(&range.start,&CStack_78);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&CStack_78.sourceCode);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_38.sourceCode);
  bVar1 = CodeLocation::isEmpty(&range.start);
  if (!bVar1) {
    UTF8Reader::operator++(&range.start.location);
    local_48.sourceCode.object = range.start.sourceCode.object;
    if (range.start.sourceCode.object != (SourceCodeText *)0x0) {
      ((range.start.sourceCode.object)->super_RefCountedObject).refCount =
           ((range.start.sourceCode.object)->super_RefCountedObject).refCount + 1;
    }
    local_48.location.data = range.start.location.data;
    SourceCodeUtilities::findEndOfExpression((SourceCodeUtilities *)&CStack_78,&local_48);
    CodeLocation::operator=(&range.end,&CStack_78);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&CStack_78.sourceCode);
    RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_48.sourceCode);
    CodeLocationRange::toString_abi_cxx11_(&local_28,&range);
    choc::text::trim(__return_storage_ptr__,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    CodeLocationRange::~CodeLocationRange(&range);
    return __return_storage_ptr__;
  }
  throwInternalCompilerError("! range.start.isEmpty()","getInitialiserValue",0x111);
}

Assistant:

static std::string getInitialiserValue (CodeLocation name)
{
    CodeLocationRange range;
    range.start = SourceCodeUtilities::findNextOccurrence (name, '=');
    SOUL_ASSERT (! range.start.isEmpty());
    ++(range.start.location);
    range.end = SourceCodeUtilities::findEndOfExpression (range.start);
    return choc::text::trim (range.toString());
}